

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_benchmark.c
# Opt level: O3

int main(void)

{
  rle16_t *prVar1;
  ushort uVar2;
  uint16_t uVar3;
  uint *puVar4;
  uint uVar5;
  run_container_t *prVar6;
  ulong uVar7;
  void *pvVar8;
  undefined4 extraout_var;
  rle16_t *prVar9;
  undefined4 extraout_var_00;
  run_container_t *prVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  run_container_t *prVar15;
  long lVar16;
  int card;
  int card_1;
  int iVar17;
  int32_t iVar18;
  char *pcVar19;
  int x_1;
  int iVar20;
  int iVar21;
  int i_1;
  uint uVar22;
  int x;
  int iVar23;
  int i;
  int iVar24;
  long lVar25;
  bool bVar26;
  float fVar27;
  timespec ts;
  timespec local_78;
  run_container_t *local_68;
  run_container_t *local_60;
  run_container_t *local_58;
  run_container_t *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  puVar4 = (uint *)cpuid_Version_info(1);
  uVar14 = (ulong)puVar4[3];
  uVar5 = *puVar4 >> 4;
  if (uVar5 < 0x406c) {
    if (uVar5 < 0x2065) {
      if (uVar5 < 0x266) {
        if (uVar5 < 0x6d) {
          uVar14 = (ulong)(uVar5 - 99);
          if (uVar5 - 99 < 2) {
            pcVar19 = "Prescott";
            goto LAB_00101557;
          }
          if (uVar5 == 0x66) {
            pcVar19 = "Presler";
            goto LAB_00101557;
          }
        }
        else {
          if (uVar5 == 0x6d) {
            pcVar19 = "Dothan";
            goto LAB_00101557;
          }
          if (uVar5 == 0x6f) goto switchD_00101304_caseD_0;
          if (uVar5 == 0x16c) {
            pcVar19 = "Pineview";
            goto LAB_00101557;
          }
        }
      }
      else {
        uVar7 = (ulong)(uVar5 - 0x1066);
        if (uVar5 - 0x1066 < 9) {
          uVar14 = (long)&switchD_00101304::switchdataD_00105014 +
                   (long)(int)(&switchD_00101304::switchdataD_00105014)[uVar7];
          switch(uVar7) {
          case 0:
switchD_00101304_caseD_0:
            pcVar19 = "Merom";
            goto LAB_00101557;
          case 1:
          case 7:
            pcVar19 = "Penryn";
            goto LAB_00101557;
          case 4:
          case 8:
switchD_00101304_caseD_4:
            pcVar19 = "Nehalem";
            goto LAB_00101557;
          }
        }
        else {
          uVar14 = uVar7;
          if (uVar5 == 0x266) {
            pcVar19 = "Lincroft";
            goto LAB_00101557;
          }
          if (uVar5 == 0x366) {
            pcVar19 = "Cedarview";
            goto LAB_00101557;
          }
        }
      }
    }
    else if (uVar5 < 0x306a) {
      uVar5 = uVar5 - 0x2065;
      if (uVar5 < 0xb) {
        uVar14 = 0x481;
        if ((0x481U >> (uVar5 & 0x1f) & 1) != 0) {
          pcVar19 = "Westmere";
          goto LAB_00101557;
        }
        uVar14 = 0x120;
        if ((0x120U >> (uVar5 & 0x1f) & 1) != 0) {
          pcVar19 = "SandyBridge";
          goto LAB_00101557;
        }
        if (uVar5 == 9) goto switchD_00101304_caseD_4;
      }
    }
    else if (uVar5 < 0x306d) {
      if (uVar5 == 0x306a) {
        pcVar19 = "IvyBridge";
        goto LAB_00101557;
      }
      if (uVar5 == 0x306c) {
        pcVar19 = "Haswell";
        goto LAB_00101557;
      }
    }
    else {
      if (uVar5 == 0x306d) {
        pcVar19 = "Broadwell";
        goto LAB_00101557;
      }
      if (uVar5 == 0x30f1) goto LAB_001014ea;
    }
  }
  else if (uVar5 < 0x9067) {
    if (uVar5 < 0x706a) {
      if (uVar5 < 0x606a) {
        if (uVar5 == 0x406c) {
          pcVar19 = "CherryTrail";
          goto LAB_00101557;
        }
        if (uVar5 == 0x506c) goto LAB_0010148a;
        if (uVar5 == 0x506e) {
          pcVar19 = "Skylake";
          goto LAB_00101557;
        }
      }
      else {
        if (uVar5 == 0x606a) {
LAB_00101496:
          pcVar19 = "Icelake";
          goto LAB_00101557;
        }
        if ((uVar5 == 0x60f0) || (uVar5 == 0x60f8)) {
LAB_001014ea:
          pcVar19 = "Zen2";
          goto LAB_00101557;
        }
      }
    }
    else if (uVar5 < 0x806c) {
      if (uVar5 == 0x706a) {
LAB_0010148a:
        pcVar19 = "Goldmont";
        goto LAB_00101557;
      }
      if (uVar5 == 0x706e) goto LAB_00101496;
      if (uVar5 == 0x70f1) goto LAB_001014ea;
    }
    else {
      uVar14 = (ulong)(uVar5 - 0x806c);
      if (uVar5 - 0x806c < 2) {
        pcVar19 = "TigerLake";
        goto LAB_00101557;
      }
      if (uVar5 == 0x806e) {
LAB_001014fa:
        pcVar19 = "Kabylake";
        goto LAB_00101557;
      }
    }
  }
  else if (uVar5 < 0xa067) {
    if (uVar5 < 0x90f0) {
      if ((uVar5 == 0x9067) || (uVar5 == 0x906a)) {
        pcVar19 = "Alderlake";
        goto LAB_00101557;
      }
      if (uVar5 == 0x906e) goto LAB_001014fa;
    }
    else {
      uVar14 = (ulong)(uVar5 - 0xa065);
      if (uVar5 - 0xa065 < 2) {
        pcVar19 = "Cometlake";
        goto LAB_00101557;
      }
      if (uVar5 == 0x90f0) goto LAB_001014ea;
    }
  }
  else if (uVar5 < 0x40f40) {
    if (uVar5 == 0xa067) {
      pcVar19 = "Rocketlake";
      goto LAB_00101557;
    }
    if (uVar5 == 0xb067) {
      pcVar19 = "Raptorlake";
      goto LAB_00101557;
    }
    if (uVar5 == 0x20f10) goto LAB_001014a2;
  }
  else {
    if (uVar5 == 0x40f40) {
      pcVar19 = "Zen3+";
      goto LAB_00101557;
    }
    if (uVar5 == 0x50f00) {
LAB_001014a2:
      pcVar19 = "Zen3";
      goto LAB_00101557;
    }
    if (uVar5 == 0x60f10) {
      pcVar19 = "Zen4";
      goto LAB_00101557;
    }
  }
  pcVar19 = "unknown";
LAB_00101557:
  iVar24 = 0;
  printf("x64 processor:  %s\t",pcVar19,(ulong)puVar4[2],uVar14);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar25 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar25 + 0xc) != '@') {
    lVar25 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar25 + 0xc),
           (ulong)*(uint *)(lVar25 + 8),(ulong)*(uint *)(lVar25 + 0xc));
  }
  puts("run container benchmarks");
  prVar6 = run_container_create();
  printf("%s: ","add_test(B)");
  fflush((FILE *)0x0);
  uVar14 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_78);
    lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
    local_68 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
    uVar5 = 0xfffffffd;
    do {
      uVar5 = uVar5 + 3;
      run_container_add(prVar6,(uint16_t)uVar5);
    } while (uVar5 < 0xfffd);
    clock_gettime(3,&local_78);
    uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000 +
            (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_68);
    if (uVar7 < uVar14) {
      uVar14 = uVar7;
    }
    iVar24 = iVar24 + 1;
  } while (iVar24 != 500);
  printf(" %.2f cycles per operation",(double)((float)uVar14 * 0.00048828125));
  putchar(10);
  iVar23 = 0;
  fflush((FILE *)0x0);
  prVar9 = prVar6->runs;
  iVar24 = 0;
  do {
    if (prVar6->n_runs < 1) {
LAB_00101705:
      iVar17 = 0;
    }
    else {
      uVar14 = 0;
      iVar17 = prVar6->n_runs + -1;
      do {
        uVar5 = (uint)(iVar17 + (int)uVar14) >> 1;
        if (prVar9[uVar5].value < (ushort)iVar23) {
          uVar14 = (ulong)(uVar5 + 1);
        }
        else {
          if (prVar9[uVar5].value <= (ushort)iVar23) {
            iVar17 = 1;
            goto LAB_0010170e;
          }
          iVar17 = uVar5 - 1;
        }
      } while ((int)uVar14 <= iVar17);
      if (((int)uVar14 == 0) ||
         (iVar17 = 1,
         (int)(uint)prVar9[uVar14 - 1].length < (int)(iVar23 - (uint)prVar9[uVar14 - 1].value)))
      goto LAB_00101705;
    }
LAB_0010170e:
    iVar24 = iVar24 + iVar17;
    iVar23 = iVar23 + 1;
    if (iVar23 == 0x10000) {
      bVar26 = false;
      printf("%s: ","contains_test(B)");
      fflush((FILE *)0x0);
      uVar14 = 0xffffffffffffffff;
      iVar23 = 0;
      do {
        clock_gettime(3,&local_78);
        local_60 = (run_container_t *)CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
        local_68 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
        prVar9 = prVar6->runs;
        iVar20 = 0;
        iVar17 = 0;
        do {
          if (prVar6->n_runs < 1) {
LAB_001017c7:
            iVar21 = 0;
          }
          else {
            uVar7 = 0;
            iVar21 = prVar6->n_runs + -1;
            do {
              uVar5 = (uint)(iVar21 + (int)uVar7) >> 1;
              if (prVar9[uVar5].value < (ushort)iVar20) {
                uVar7 = (ulong)(uVar5 + 1);
              }
              else {
                if (prVar9[uVar5].value <= (ushort)iVar20) {
                  iVar21 = 1;
                  goto LAB_001017d2;
                }
                iVar21 = uVar5 - 1;
              }
            } while ((int)uVar7 <= iVar21);
            if (((int)uVar7 == 0) ||
               (iVar21 = 1,
               (int)(uint)prVar9[uVar7 - 1].length < (int)(iVar20 - (uint)prVar9[uVar7 - 1].value)))
            goto LAB_001017c7;
          }
LAB_001017d2:
          iVar17 = iVar17 + iVar21;
          iVar20 = iVar20 + 1;
        } while (iVar20 != 0x10000);
        if (iVar17 != iVar24) {
          bVar26 = true;
        }
        clock_gettime(3,&local_78);
        uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - (long)local_60) * 1000000000
                + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_68);
        if (uVar7 < uVar14) {
          uVar14 = uVar7;
        }
        iVar23 = iVar23 + 1;
        if (iVar23 == 500) {
          printf(" %.2f cycles per operation",(double)((float)uVar14 * 1.5258789e-05));
          if (bVar26) {
            printf(" [ERROR]");
          }
          putchar(10);
          pvVar8 = (void *)0x0;
          fflush((FILE *)0x0);
          printf("%s: ","remove_test(B)");
          fflush((FILE *)0x0);
          prVar15 = (run_container_t *)0xffffffffffffffff;
          do {
            local_60 = (run_container_t *)pvVar8;
            local_50 = prVar15;
            clock_gettime(3,&local_78);
            local_48 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
            local_58 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
            iVar18 = prVar6->n_runs;
            uVar5 = 0;
            do {
              if (0 < iVar18) {
                prVar9 = prVar6->runs;
                iVar24 = iVar18 + -1;
                uVar22 = 0;
                do {
                  uVar12 = iVar24 + uVar22 >> 1;
                  uVar2 = prVar9[uVar12].value;
                  if (uVar2 < (ushort)uVar5) {
                    uVar22 = uVar12 + 1;
                  }
                  else {
                    if (uVar2 <= (ushort)uVar5) {
                      uVar3 = prVar9[uVar12].length;
                      if (uVar3 == 0) {
                        memmove(prVar9 + (ushort)uVar12,prVar9 + (ulong)(ushort)uVar12 + 1,
                                (long)(int)(iVar18 + ~(uVar12 & 0xffff)) << 2);
                        iVar18 = prVar6->n_runs + -1;
                        prVar6->n_runs = iVar18;
                      }
                      else {
                        prVar9[uVar12].value = uVar2 + 1;
                        prVar9[uVar12].length = uVar3 - 1;
                      }
                      goto LAB_001019fc;
                    }
                    iVar24 = uVar12 - 1;
                  }
                } while ((int)uVar22 <= iVar24);
                if (uVar22 != 0) {
                  uVar12 = uVar5 - prVar9[(ulong)uVar22 - 1].value;
                  uVar2 = prVar9[(ulong)uVar22 - 1].length;
                  if ((int)uVar12 < (int)(uint)uVar2) {
                    prVar9[(ulong)uVar22 - 1].length = (ushort)uVar12 - 1;
                    if (prVar6->capacity <= iVar18) {
                      run_container_grow(prVar6,iVar18 + 1,true);
                      iVar18 = prVar6->n_runs;
                      prVar9 = prVar6->runs;
                    }
                    local_68 = (run_container_t *)CONCAT44(local_68._4_4_,uVar5 + 1);
                    uVar13 = uVar22 & 0xffff;
                    memmove(prVar9 + (ulong)uVar13 + 1,prVar9 + uVar13,
                            (long)(int)(iVar18 - uVar13) << 2);
                    iVar18 = prVar6->n_runs + 1;
                    prVar6->n_runs = iVar18;
                    prVar9 = prVar6->runs;
                    prVar9[uVar22].value = (uint16_t)local_68;
                    prVar9[uVar22].length = uVar2 + ~(ushort)uVar12;
                  }
                  else if (uVar12 == uVar2) {
                    prVar9[(ulong)uVar22 - 1].length = uVar2 - 1;
                  }
                }
              }
LAB_001019fc:
              bVar26 = uVar5 < 0xfffd;
              uVar5 = uVar5 + 3;
            } while (bVar26);
            clock_gettime(3,&local_78);
            pvVar8 = (void *)((CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - local_48) *
                              1000000000 +
                             (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) -
                             (long)local_58));
            prVar15 = local_50;
            if (pvVar8 < local_50) {
              prVar15 = (run_container_t *)pvVar8;
            }
            uVar5 = (int)local_60 + 1;
            pvVar8 = (void *)(ulong)uVar5;
          } while (uVar5 != 500);
          printf(" %.2f cycles per operation",(double)((float)prVar15 / 21845.0));
          putchar(10);
          fflush((FILE *)0x0);
          run_container_free(prVar6);
          pvVar8 = (void *)0x20;
          do {
            prVar6 = run_container_create();
            local_50 = (run_container_t *)pvVar8;
            do {
              uVar5 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
              bVar11 = (byte)(pcg32_global_0 >> 0x3b);
              pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
              run_container_add(prVar6,(ushort)(uVar5 >> bVar11) | (ushort)(uVar5 << 0x20 - bVar11))
              ;
              uVar5 = (int)pvVar8 - 1;
              pvVar8 = (void *)(ulong)uVar5;
            } while (uVar5 != 0);
            uVar5 = run_container_cardinality(prVar6);
            bVar26 = false;
            printf("\n number of values in container = %d\n",(ulong)uVar5);
            iVar24 = run_container_cardinality(prVar6);
            local_68 = (run_container_t *)CONCAT44(extraout_var,iVar24);
            local_58 = (run_container_t *)(long)iVar24;
            local_60 = (run_container_t *)malloc((long)local_58 * 4);
            printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
            fflush((FILE *)0x0);
            iVar24 = 500;
            uVar14 = 0xffffffffffffffff;
            do {
              clock_gettime(3,&local_78);
              lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
              lVar16 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
              iVar23 = run_container_to_uint32_array(local_60,prVar6,0x4d2);
              if (iVar23 != (int)local_68) {
                bVar26 = true;
              }
              clock_gettime(3,&local_78);
              prVar15 = local_60;
              uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000 +
                      (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar16);
              if (uVar14 <= uVar7) {
                uVar7 = uVar14;
              }
              iVar24 = iVar24 + -1;
              uVar14 = uVar7;
            } while (iVar24 != 0);
            if ((long)local_58 < 0) {
              fVar27 = (float)((ulong)((uint)local_68 & 1) | (ulong)local_58 >> 1);
              fVar27 = fVar27 + fVar27;
            }
            else {
              fVar27 = (float)(int)(uint)local_68;
            }
            printf(" %.2f cycles per operation",(double)((float)uVar7 / fVar27));
            if (bVar26) {
              printf(" [ERROR]");
            }
            putchar(10);
            iVar24 = 0;
            fflush((FILE *)0x0);
            free(prVar15);
            printf("%s %s: ","run_container_contains","run_cache_prefetch");
            fflush((FILE *)0x0);
            lVar25 = 0;
            do {
              lVar16 = cpuid(0x80000006);
              if (0 < prVar6->n_runs) {
                uVar14 = 0;
                do {
                  uVar14 = uVar14 + (*(uint *)(lVar16 + 0xc) >> 1 & 0x7f);
                } while (uVar14 < (ulong)(uint)prVar6->n_runs * 2);
              }
              clock_gettime(3,&local_78);
              iVar17 = (int)local_78.tv_nsec;
              iVar23 = (int)local_78.tv_sec;
              clock_gettime(3,&local_78);
              iVar24 = ((int)local_78.tv_sec - iVar23) * 1000000000 +
                       iVar24 + ((int)local_78.tv_nsec - iVar17);
              lVar25 = lVar25 + 1;
            } while (lVar25 != 0x400);
            printf(" %.2f cycles per operation",(double)((float)iVar24 * 0.0009765625));
            putchar(10);
            iVar24 = 0;
            fflush((FILE *)0x0);
            printf("%s %s: ","run_container_contains","run_cache_flush");
            fflush((FILE *)0x0);
            lVar25 = 0;
            do {
              lVar16 = cpuid(0x80000006);
              if (0 < prVar6->n_runs) {
                uVar5 = *(uint *)(lVar16 + 0xc) >> 1 & 0x7f;
                lVar16 = 0;
                iVar23 = 0;
                do {
                  clflush(*(undefined1 *)((long)&prVar6->runs->value + lVar16));
                  iVar23 = iVar23 + uVar5;
                  lVar16 = lVar16 + (ulong)(uVar5 * 4);
                } while (iVar23 < prVar6->n_runs * 2);
              }
              clock_gettime(3,&local_78);
              iVar17 = (int)local_78.tv_nsec;
              iVar23 = (int)local_78.tv_sec;
              clock_gettime(3,&local_78);
              iVar24 = ((int)local_78.tv_sec - iVar23) * 1000000000 +
                       iVar24 + ((int)local_78.tv_nsec - iVar17);
              lVar25 = lVar25 + 1;
            } while (lVar25 != 0x400);
            printf(" %.2f cycles per operation",(double)((float)iVar24 * 0.0009765625));
            putchar(10);
            fflush((FILE *)0x0);
            run_container_free(prVar6);
            pvVar8 = (void *)(ulong)((uint)local_50 * 8);
          } while ((uint)local_50 < 0x2001);
          puts("==dense range test ");
          local_68 = (run_container_t *)0x20;
          do {
            prVar6 = run_container_create();
            iVar18 = prVar6->n_runs;
            iVar24 = 0;
            do {
              uVar5 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
              bVar11 = (byte)(pcg32_global_0 >> 0x3b);
              pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
              uVar22 = (uVar5 >> bVar11 | uVar5 << 0x20 - bVar11) & 0xfff;
              uVar5 = uVar22 + 0x1000;
              prVar9 = prVar6->runs;
              uVar14 = 0;
              iVar23 = 0;
              uVar2 = (ushort)uVar22;
              if (iVar18 != 0) {
                if (iVar18 < 1) {
                  iVar23 = 0;
                }
                else {
                  iVar17 = iVar18 + -1;
                  iVar23 = 0;
                  do {
                    uVar12 = (uint)(iVar17 + iVar23) >> 1;
                    if ((ushort)(prVar9[uVar12].length + prVar9[uVar12].value) < (ushort)uVar5) {
                      iVar23 = uVar12 + 1;
                    }
                    else {
                      if (prVar9[uVar12].value <= (ushort)(uVar2 + 0x1001)) {
                        iVar23 = ~uVar12 + iVar18;
                        goto LAB_00101f23;
                      }
                      iVar17 = uVar12 - 1;
                    }
                  } while (iVar23 <= iVar17);
                }
                iVar23 = iVar18 - iVar23;
              }
LAB_00101f23:
              iVar17 = iVar18 - iVar23;
              if (iVar17 != 0 && iVar23 <= iVar18) {
                iVar20 = iVar17 + -1;
                uVar14 = 0;
                do {
                  uVar12 = (uint)(iVar20 + (int)uVar14) >> 1;
                  if ((ushort)(prVar9[uVar12].length + prVar9[uVar12].value) + 1 < uVar22) {
                    uVar14 = (ulong)(uVar12 + 1);
                  }
                  else {
                    if (prVar9[uVar12].value <= uVar2) {
                      uVar14 = (ulong)uVar12;
                      break;
                    }
                    iVar20 = uVar12 - 1;
                  }
                } while ((int)uVar14 <= iVar20);
              }
              if (iVar18 == (int)uVar14 + iVar23) {
                if (prVar6->capacity <= iVar18) {
                  run_container_grow(prVar6,iVar18 + 1,true);
                  iVar18 = prVar6->n_runs;
                  prVar9 = prVar6->runs;
                }
                uVar7 = uVar14 & 0xffff;
                memmove(prVar9 + uVar7 + 1,prVar9 + uVar7,(long)(iVar18 - (int)uVar7) << 2);
                iVar18 = prVar6->n_runs + 1;
                prVar6->n_runs = iVar18;
                prVar9 = prVar6->runs;
                prVar9[uVar14].value = uVar2;
                prVar9[uVar14].length = (ushort)uVar5 - uVar2;
              }
              else {
                prVar1 = prVar9 + uVar14;
                prVar9 = prVar9 + iVar17;
                uVar12 = (uint)prVar9[-1].length + (uint)prVar9[-1].value;
                if (prVar1->value < uVar22) {
                  uVar22 = (uint)prVar1->value;
                }
                if (uVar12 <= uVar5) {
                  uVar12 = uVar5;
                }
                prVar1->value = (uint16_t)uVar22;
                prVar1->length = (short)uVar12 - (uint16_t)uVar22;
                memmove(prVar1 + 1,prVar9,(long)iVar23 << 2);
                iVar18 = (int)uVar14 + iVar23 + 1;
                prVar6->n_runs = iVar18;
              }
              iVar24 = iVar24 + 1;
            } while (iVar24 != (int)local_68);
            uVar5 = run_container_cardinality(prVar6);
            bVar26 = false;
            printf("\n number of values in container = %d\n",(ulong)uVar5);
            iVar24 = run_container_cardinality(prVar6);
            local_60 = (run_container_t *)CONCAT44(extraout_var_00,iVar24);
            local_48 = (ulong)iVar24;
            local_50 = (run_container_t *)malloc(local_48 * 4);
            printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
            fflush((FILE *)0x0);
            iVar24 = 500;
            uVar14 = 0xffffffffffffffff;
            local_58 = prVar6;
            do {
              clock_gettime(3,&local_78);
              lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
              lVar16 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
              iVar23 = run_container_to_uint32_array(local_50,local_58,0x4d2);
              if (iVar23 != (int)local_60) {
                bVar26 = true;
              }
              clock_gettime(3,&local_78);
              prVar15 = local_50;
              prVar6 = local_58;
              uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000 +
                      (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar16);
              if (uVar14 <= uVar7) {
                uVar7 = uVar14;
              }
              iVar24 = iVar24 + -1;
              uVar14 = uVar7;
            } while (iVar24 != 0);
            if ((long)local_48 < 0) {
              fVar27 = (float)((ulong)((uint)local_60 & 1) | local_48 >> 1);
              fVar27 = fVar27 + fVar27;
            }
            else {
              fVar27 = (float)(int)(uint)local_60;
            }
            printf(" %.2f cycles per operation",(double)((float)uVar7 / fVar27));
            if (bVar26) {
              printf(" [ERROR]");
            }
            putchar(10);
            fflush((FILE *)0x0);
            free(prVar15);
            run_container_free(prVar6);
            uVar5 = (uint)local_68;
            local_68 = (run_container_t *)(ulong)(uVar5 * 8);
            if (0x2000 < uVar5) {
              putchar(10);
              uVar5 = 0xfffffffd;
              local_68 = run_container_create();
              do {
                uVar5 = uVar5 + 3;
                run_container_add(local_68,(uint16_t)uVar5);
              } while (uVar5 < 0xfffd);
              uVar5 = 0xfffffffb;
              prVar6 = run_container_create();
              do {
                uVar5 = uVar5 + 5;
                run_container_add(prVar6,(uint16_t)uVar5);
              } while (uVar5 < 0xfffb);
              prVar10 = run_container_create();
              puts("\nUnion and intersections...");
              puts("\nNote:");
              puts("union times are expressed in cycles per number of input elements (both runs)");
              puts("intersection times are expressed in cycles per number of output elements\n");
              puts("==intersection and union test 1 ");
              prVar15 = local_68;
              uVar5 = run_container_cardinality(local_68);
              uVar22 = run_container_cardinality(prVar6);
              bVar26 = false;
              printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar5,
                     (ulong)uVar22);
              run_container_union(prVar15,prVar6,prVar10);
              local_50 = prVar10;
              uVar5 = run_container_cardinality(prVar10);
              local_48 = CONCAT44(local_48._4_4_,uVar5);
              printf("union cardinality = %d \n",(ulong)uVar5);
              uVar5 = run_container_cardinality(prVar15);
              uVar22 = run_container_cardinality(prVar6);
              printf("B1 card = %d B2 card = %d \n",(ulong)uVar5,(ulong)uVar22);
              local_38 = (long)prVar15->n_runs;
              local_40 = (long)prVar6->n_runs;
              printf("%s: ","union_test(B1, B2, BO)");
              fflush((FILE *)0x0);
              prVar15 = local_50;
              iVar24 = 500;
              uVar14 = 0xffffffffffffffff;
              local_60 = prVar6;
              do {
                clock_gettime(3,&local_78);
                lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
                local_58 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec)
                ;
                run_container_union(local_68,local_60,prVar15);
                iVar23 = run_container_cardinality(prVar15);
                if (iVar23 != (int)local_48) {
                  bVar26 = true;
                }
                clock_gettime(3,&local_78);
                prVar10 = local_50;
                prVar6 = local_60;
                uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000
                        + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_58);
                if (uVar14 <= uVar7) {
                  uVar7 = uVar14;
                }
                iVar24 = iVar24 + -1;
                uVar14 = uVar7;
              } while (iVar24 != 0);
              printf(" %.2f cycles per operation",
                     (double)((float)uVar7 / (float)(ulong)(local_40 + local_38)));
              if (bVar26) {
                printf(" [ERROR]");
              }
              putchar(10);
              bVar26 = false;
              fflush((FILE *)0x0);
              run_container_intersection(local_68,prVar6,prVar10);
              uVar5 = run_container_cardinality(prVar10);
              local_58 = (run_container_t *)CONCAT44(extraout_var_01,uVar5);
              printf("intersection cardinality = %d \n",(ulong)uVar5);
              printf("%s: ","intersection_test(B1, B2, BO)");
              fflush((FILE *)0x0);
              prVar6 = local_50;
              iVar24 = 500;
              uVar14 = 0xffffffffffffffff;
              do {
                clock_gettime(3,&local_78);
                lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
                lVar16 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
                run_container_intersection(local_68,local_60,prVar6);
                iVar23 = run_container_cardinality(prVar6);
                if (iVar23 != (int)local_58) {
                  bVar26 = true;
                }
                clock_gettime(3,&local_78);
                prVar15 = local_60;
                uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000
                        + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar16);
                if (uVar14 <= uVar7) {
                  uVar7 = uVar14;
                }
                iVar24 = iVar24 + -1;
                uVar14 = uVar7;
              } while (iVar24 != 0);
              uVar5 = (uint)local_58;
              if ((long)(int)uVar5 < 0) {
                fVar27 = (float)((ulong)(uVar5 & 1) | (ulong)(long)(int)uVar5 >> 1);
                fVar27 = fVar27 + fVar27;
              }
              else {
                fVar27 = (float)(int)uVar5;
              }
              printf(" %.2f cycles per operation",(double)((float)uVar7 / fVar27));
              if (bVar26) {
                printf(" [ERROR]");
              }
              putchar(10);
              fflush((FILE *)0x0);
              puts("==intersection and union test 2 ");
              local_68->n_runs = 0;
              prVar15->n_runs = 0;
              uVar5 = 0;
              do {
                uVar22 = uVar5 + ((uVar5 & 0xffff) / 0xb) * -0xb;
                if ((short)uVar22 != 0) {
                  uVar12 = 0;
                  do {
                    run_container_add(local_68,(short)uVar5 + (short)uVar12);
                    uVar12 = uVar12 + 1;
                  } while (uVar12 < (uVar22 & 0xffff));
                }
                bVar26 = uVar5 < 0xffc0;
                uVar5 = uVar5 + 0x40;
              } while (bVar26);
              iVar24 = 1;
              do {
                run_container_add(prVar15,(uint16_t)iVar24);
                prVar6 = local_68;
                bVar26 = iVar24 < 0x8000;
                iVar24 = iVar24 * 2;
              } while (bVar26);
              uVar5 = run_container_cardinality(local_68);
              uVar22 = run_container_cardinality(prVar15);
              bVar26 = false;
              printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar5,
                     (ulong)uVar22);
              prVar10 = local_50;
              run_container_union(prVar6,prVar15,local_50);
              uVar5 = run_container_cardinality(prVar10);
              local_58 = (run_container_t *)CONCAT44(local_58._4_4_,uVar5);
              printf("union cardinality = %d \n",(ulong)uVar5);
              uVar5 = run_container_cardinality(prVar6);
              uVar22 = run_container_cardinality(prVar15);
              printf("B1 card = %d B2 card = %d \n",(ulong)uVar5,(ulong)uVar22);
              local_40 = (long)prVar6->n_runs;
              local_48 = (ulong)prVar15->n_runs;
              printf("%s: ","union_test(B1, B2, BO)");
              fflush((FILE *)0x0);
              iVar24 = 500;
              uVar14 = 0xffffffffffffffff;
              do {
                clock_gettime(3,&local_78);
                prVar6 = local_50;
                lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
                lVar16 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
                run_container_union(local_68,local_60,local_50);
                iVar23 = run_container_cardinality(prVar6);
                if (iVar23 != (int)local_58) {
                  bVar26 = true;
                }
                clock_gettime(3,&local_78);
                prVar15 = local_50;
                prVar6 = local_60;
                uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000
                        + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar16);
                if (uVar14 <= uVar7) {
                  uVar7 = uVar14;
                }
                iVar24 = iVar24 + -1;
                uVar14 = uVar7;
              } while (iVar24 != 0);
              printf(" %.2f cycles per operation",
                     (double)((float)uVar7 / (float)(local_48 + local_40)));
              if (bVar26) {
                printf(" [ERROR]");
              }
              putchar(10);
              bVar26 = false;
              fflush((FILE *)0x0);
              run_container_intersection(local_68,prVar6,prVar15);
              uVar5 = run_container_cardinality(prVar15);
              local_58 = (run_container_t *)CONCAT44(extraout_var_02,uVar5);
              printf("intersection cardinality = %d \n",(ulong)uVar5);
              printf("%s: ","intersection_test(B1, B2, BO)");
              fflush((FILE *)0x0);
              prVar6 = local_50;
              iVar24 = 500;
              uVar14 = 0xffffffffffffffff;
              do {
                clock_gettime(3,&local_78);
                lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
                lVar16 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
                run_container_intersection(local_68,local_60,prVar6);
                iVar23 = run_container_cardinality(prVar6);
                if (iVar23 != (int)local_58) {
                  bVar26 = true;
                }
                clock_gettime(3,&local_78);
                prVar15 = local_60;
                uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000
                        + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar16);
                if (uVar14 <= uVar7) {
                  uVar7 = uVar14;
                }
                iVar24 = iVar24 + -1;
                uVar14 = uVar7;
              } while (iVar24 != 0);
              uVar5 = (uint)local_58;
              if ((long)(int)uVar5 < 0) {
                fVar27 = (float)((ulong)(uVar5 & 1) | (ulong)(long)(int)uVar5 >> 1);
                fVar27 = fVar27 + fVar27;
              }
              else {
                fVar27 = (float)(int)uVar5;
              }
              printf(" %.2f cycles per operation",(double)((float)uVar7 / fVar27));
              if (bVar26) {
                printf(" [ERROR]");
              }
              putchar(10);
              fflush((FILE *)0x0);
              run_container_free(local_68);
              run_container_free(prVar15);
              run_container_free(local_50);
              return 0;
            }
          } while( true );
        }
      } while( true );
    }
  } while( true );
}

Assistant:

int main() {
    int repeat = 500;
    int size = TESTSIZE;
    tellmeall();
    printf("run container benchmarks\n");
    run_container_t* B = run_container_create();
    BEST_TIME(add_test(B), 0, repeat, size);
    int answer = contains_test(B);
    size = 1 << 16;
    BEST_TIME(contains_test(B), answer, repeat, size);
    size = (1 << 16) / 3;
    BEST_TIME(remove_test(B), 0, repeat, size);
    run_container_free(B);

    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            run_container_add(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        run_container_free(Bt);
    }

    printf("==dense range test \n");
    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            uint16_t min = (uint16_t)pcg32_random() % 4096;
            uint16_t max = min + 4096;
            int32_t nruns_greater =
                rle16_count_greater(Bt->runs, Bt->n_runs, max);
            int32_t nruns_less =
                rle16_count_less(Bt->runs, Bt->n_runs - nruns_greater, min);
            run_container_add_range_nruns(Bt, min, max, nruns_less,
                                          nruns_greater);
        }
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);

        run_container_free(Bt);
    }

    printf("\n");

    run_container_t* B1 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        run_container_add(B1, (uint16_t)x);
    }
    run_container_t* B2 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        run_container_add(B2, (uint16_t)x);
    }
    int32_t inputsize;
    inputsize = B1->n_runs + B2->n_runs;
    run_container_t* BO = run_container_create();
    printf("\nUnion and intersections...\n");
    printf("\nNote:\n");
    printf(
        "union times are expressed in cycles per number of input elements "
        "(both runs)\n");
    printf(
        "intersection times are expressed in cycles per number of output "
        "elements\n\n");
    printf("==intersection and union test 1 \n");
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;
    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);
    printf("==intersection and union test 2 \n");
    B1->n_runs = 0;
    B2->n_runs = 0;
    for (int x = 0; x < (1 << 16); x += 64) {
        int length = x % 11;
        for (int y = 0; y < length; ++y)
            run_container_add(B1, (uint16_t)(x + y));
    }
    for (int x = 1; x < 1 << 16; x += x) {
        run_container_add(B2, (uint16_t)x);
    }
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;

    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);

    run_container_free(B1);
    run_container_free(B2);
    run_container_free(BO);
    return 0;
}